

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuzzyHammerer.cpp
# Opt level: O2

void FuzzyHammerer::probe_mapping_and_scan
               (PatternAddressMapper *mapper,Memory *memory,FuzzingParameterSet *fuzzing_params,
               size_t num_dram_locations)

{
  FLUSHING_STRATEGY flushing;
  FENCING_STRATEGY fencing;
  size_t args;
  _Alloc_hider args_1;
  FuzzingParameterSet *pFVar1;
  bool sync_each_ref;
  int iVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  vector<std::vector<BitFlip,_std::allocator<BitFlip>_>,_std::allocator<std::vector<BitFlip,_std::allocator<BitFlip>_>_>_>
  *this;
  string *psVar5;
  size_t sVar6;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *p_Var7;
  _Hashtable<AggressorAccessPattern,_AggressorAccessPattern,_std::allocator<AggressorAccessPattern>,_std::__detail::_Identity,_std::equal_to<AggressorAccessPattern>,_std::hash<AggressorAccessPattern>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_27f0 [89];
  undefined1 local_1468 [8];
  mt19937 gen;
  undefined1 auStack_c8 [8];
  vector<volatile_char_*,_std::allocator<volatile_char_*>_> hammering_accesses_vec;
  undefined1 auStack_98 [8];
  vector<volatile_char_*,_std::allocator<volatile_char_*>_> random_rows;
  long local_78;
  size_t flipped_bits;
  size_t local_68;
  long local_60;
  undefined8 local_58;
  uint local_4c;
  FuzzingParameterSet *local_48;
  CodeJitter *local_40;
  PatternAddressMapper *local_38;
  
  local_68 = num_dram_locations;
  local_40 = PatternAddressMapper::get_code_jitter(mapper);
  PatternAddressMapper::randomize_addresses
            (mapper,fuzzing_params,&hammering_pattern.agg_access_patterns,true);
  auStack_c8 = (undefined1  [8])0x0;
  hammering_accesses_vec.super__Vector_base<volatile_char_*,_std::allocator<volatile_char_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  hammering_accesses_vec.super__Vector_base<volatile_char_*,_std::allocator<volatile_char_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38 = mapper;
  PatternAddressMapper::export_pattern
            (mapper,&hammering_pattern.aggressors,hammering_pattern.base_period,
             (vector<volatile_char_*,_std::allocator<volatile_char_*>_> *)auStack_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1468,"Aggressor ID to DRAM address mapping (bank, row, column):",
             (allocator<char> *)local_27f0);
  Logger::log_info((string *)local_1468,true);
  std::__cxx11::string::~string((string *)local_1468);
  PatternAddressMapper::get_mapping_text_repr_abi_cxx11_((string *)local_1468,local_38);
  Logger::log_data((string *)local_1468,true);
  std::__cxx11::string::~string((string *)local_1468);
  sync_each_ref = FuzzingParameterSet::get_random_sync_each_ref(fuzzing_params);
  local_48 = fuzzing_params;
  iVar2 = FuzzingParameterSet::get_random_num_aggressors_for_sync(fuzzing_params);
  local_58 = CONCAT44(extraout_var,iVar2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1468,"Creating ASM code for hammering.",(allocator<char> *)local_27f0);
  Logger::log_info((string *)local_1468,true);
  pFVar1 = local_48;
  std::__cxx11::string::~string((string *)local_1468);
  iVar2 = FuzzingParameterSet::get_num_activations_per_t_refi(pFVar1);
  flushing = local_48->flushing_strategy;
  fencing = local_48->fencing_strategy;
  iVar3 = FuzzingParameterSet::get_hammering_total_num_activations(local_48);
  local_4c = (uint)sync_each_ref;
  CodeJitter::jit_strict
            (local_40,iVar2,flushing,fencing,
             (vector<volatile_char_*,_std::allocator<volatile_char_*>_> *)auStack_c8,sync_each_ref,
             (int)local_58,iVar3);
  local_78 = 0;
  this = &local_38->bit_flips;
  local_60 = 0;
  sVar6 = 0;
  while (local_68 != sVar6) {
    std::
    vector<std::vector<BitFlip,_std::allocator<BitFlip>_>,_std::allocator<std::vector<BitFlip,_std::allocator<BitFlip>_>_>_>
    ::emplace_back<>(this);
    flipped_bits = sVar6;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_27f0,
               "Running pattern #%lu (%s) for address set %d (%s) at DRAM location #%ld.",
               (allocator<char> *)auStack_98);
    args_1 = hammering_pattern.instance_id._M_dataplus;
    args = cnt_generated_patterns;
    sVar6 = cnt_pattern_probes;
    psVar5 = PatternAddressMapper::get_instance_id_abi_cxx11_(local_38);
    format_string<unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long>
              ((string *)local_1468,(string *)local_27f0,args,args_1._M_p,sVar6,
               (psVar5->_M_dataplus)._M_p,flipped_bits);
    Logger::log_info((string *)local_1468,true);
    std::__cxx11::string::~string((string *)local_1468);
    std::__cxx11::string::~string((string *)local_27f0);
    pFVar1 = local_48;
    iVar2 = FuzzingParameterSet::get_random_wait_until_start_hammering_us(local_48);
    FuzzingParameterSet::print_dynamic_parameters2(SUB41(local_4c,0),iVar2,(int)local_58);
    auStack_98 = (undefined1  [8])0x0;
    random_rows.super__Vector_base<volatile_char_*,_std::allocator<volatile_char_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    random_rows.super__Vector_base<volatile_char_*,_std::allocator<volatile_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    if (0 < iVar2) {
      iVar3 = FuzzingParameterSet::get_max_row_no(pFVar1);
      PatternAddressMapper::get_random_nonaccessed_rows
                ((vector<volatile_char_*,_std::allocator<volatile_char_*>_> *)local_1468,local_38,
                 iVar3);
      std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>::_M_move_assign
                ((vector<volatile_char_*,_std::allocator<volatile_char_*>_> *)auStack_98,
                 (_Vector_base<volatile_char_*,_std::allocator<volatile_char_*>_> *)local_1468);
      std::_Vector_base<volatile_char_*,_std::allocator<volatile_char_*>_>::~_Vector_base
                ((_Vector_base<volatile_char_*,_std::allocator<volatile_char_*>_> *)local_1468);
      do_random_accesses((vector<volatile_char_*,_std::allocator<volatile_char_*>_> *)auStack_98,
                         iVar2);
    }
    CodeJitter::hammer_pattern(local_40,pFVar1,true);
    sVar6 = Memory::check_memory(memory,local_38,false,true);
    local_78 = local_60 + sVar6;
    local_60 = local_78;
    std::random_device::random_device((random_device *)local_27f0);
    uVar4 = std::random_device::_M_getval();
    std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::seed((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            *)local_1468,(ulong)uVar4);
    std::random_device::~random_device((random_device *)local_27f0);
    stack0xffffffffffffff24 = 0x2000000001;
    iVar2 = Range<int>::get_random_number
                      ((Range<int> *)((long)&gen._M_p + 4),
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)local_1468);
    local_27f0[0]._M_buckets = &local_27f0[0]._M_single_bucket;
    local_27f0[0]._M_bucket_count = 1;
    local_27f0[0]._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_27f0[0]._M_element_count = 0;
    local_27f0[0]._M_rehash_policy._M_max_load_factor = 1.0;
    local_27f0[0]._M_rehash_policy._4_4_ = 0;
    local_27f0[0]._M_rehash_policy._M_next_resize = 0;
    local_27f0[0]._M_single_bucket = (__node_base_ptr)0x0;
    PatternAddressMapper::shift_mapping
              (local_38,iVar2,
               (unordered_set<AggressorAccessPattern,_std::hash<AggressorAccessPattern>,_std::equal_to<AggressorAccessPattern>,_std::allocator<AggressorAccessPattern>_>
                *)local_27f0);
    sVar6 = flipped_bits;
    std::
    _Hashtable<AggressorAccessPattern,_AggressorAccessPattern,_std::allocator<AggressorAccessPattern>,_std::__detail::_Identity,_std::equal_to<AggressorAccessPattern>,_std::hash<AggressorAccessPattern>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(local_27f0);
    sVar6 = sVar6 + 1;
    if (sVar6 < local_68) {
      if (auStack_98 ==
          (undefined1  [8])
          random_rows.super__Vector_base<volatile_char_*,_std::allocator<volatile_char_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        iVar2 = FuzzingParameterSet::get_max_row_no(pFVar1);
        PatternAddressMapper::get_random_nonaccessed_rows
                  ((vector<volatile_char_*,_std::allocator<volatile_char_*>_> *)local_27f0,local_38,
                   iVar2);
        std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>::_M_move_assign
                  ((vector<volatile_char_*,_std::allocator<volatile_char_*>_> *)auStack_98,
                   local_27f0);
        std::_Vector_base<volatile_char_*,_std::allocator<volatile_char_*>_>::~_Vector_base
                  ((_Vector_base<volatile_char_*,_std::allocator<volatile_char_*>_> *)local_27f0);
      }
      do_random_accesses((vector<volatile_char_*,_std::allocator<volatile_char_*>_> *)auStack_98,
                         64000);
    }
    std::_Vector_base<volatile_char_*,_std::allocator<volatile_char_*>_>::~_Vector_base
              ((_Vector_base<volatile_char_*,_std::allocator<volatile_char_*>_> *)auStack_98);
  }
  p_Var7 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            *)std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&map_pattern_mappings_bitflips_abi_cxx11_,
                           &hammering_pattern.instance_id);
  psVar5 = PatternAddressMapper::get_instance_id_abi_cxx11_(local_38);
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::__cxx11::string&,unsigned_long&>(p_Var7,psVar5,&local_78);
  CodeJitter::cleanup(local_40,(EVP_PKEY_CTX *)psVar5);
  std::_Vector_base<volatile_char_*,_std::allocator<volatile_char_*>_>::~_Vector_base
            ((_Vector_base<volatile_char_*,_std::allocator<volatile_char_*>_> *)auStack_c8);
  return;
}

Assistant:

void FuzzyHammerer::probe_mapping_and_scan(PatternAddressMapper &mapper, Memory &memory,
                                           FuzzingParameterSet &fuzzing_params, size_t num_dram_locations) {

  // ATTENTION: This method uses the global variable hammering_pattern to refer to the pattern that is to be hammered

  CodeJitter &code_jitter = mapper.get_code_jitter();

  // randomize the aggressor ID -> DRAM row mapping
  mapper.randomize_addresses(fuzzing_params, hammering_pattern.agg_access_patterns, true);

  // now fill the pattern with these random addresses
  std::vector<volatile char *> hammering_accesses_vec;
  mapper.export_pattern(hammering_pattern.aggressors, hammering_pattern.base_period, hammering_accesses_vec);
  Logger::log_info("Aggressor ID to DRAM address mapping (bank, row, column):");
  Logger::log_data(mapper.get_mapping_text_repr());

  // now create instructions that follow this pattern (i.e., do jitting of code)
  bool sync_at_each_ref = fuzzing_params.get_random_sync_each_ref();
  int num_aggs_for_sync = fuzzing_params.get_random_num_aggressors_for_sync();
  Logger::log_info("Creating ASM code for hammering.");
  code_jitter.jit_strict(fuzzing_params.get_num_activations_per_t_refi(),
      fuzzing_params.flushing_strategy, fuzzing_params.fencing_strategy,
      hammering_accesses_vec, sync_at_each_ref, num_aggs_for_sync,
      fuzzing_params.get_hammering_total_num_activations());

  size_t flipped_bits = 0;
  for (size_t dram_location = 0; dram_location < num_dram_locations; ++dram_location) {
    mapper.bit_flips.emplace_back();

    Logger::log_info(format_string("Running pattern #%lu (%s) for address set %d (%s) at DRAM location #%ld.",
        cnt_generated_patterns,
        hammering_pattern.instance_id.c_str(),
        cnt_pattern_probes,
        mapper.get_instance_id().c_str(),
        dram_location));

    // wait for a random time before starting to hammer, while waiting access random rows that are not part of the
    // currently hammering pattern; this wait interval serves for two purposes: to reset the sampler and start from a
    // clean state before hammering, and also to fuzz a possible dependence at which REF we start hammering
    auto wait_until_hammering_us = fuzzing_params.get_random_wait_until_start_hammering_us();
    FuzzingParameterSet::print_dynamic_parameters2(sync_at_each_ref, wait_until_hammering_us, num_aggs_for_sync);

    std::vector<volatile char *> random_rows;
    if (wait_until_hammering_us > 0) {
      random_rows = mapper.get_random_nonaccessed_rows(fuzzing_params.get_max_row_no());
      do_random_accesses(random_rows, wait_until_hammering_us);
    }

    // do hammering
    code_jitter.hammer_pattern(fuzzing_params, true);

    // check if any bit flips happened
    flipped_bits += memory.check_memory(mapper, false, true);

    // now shift the mapping to another location
    std::mt19937 gen = std::mt19937(std::random_device()());
    mapper.shift_mapping(Range<int>(1,32).get_random_number(gen), {});

    if (dram_location + 1 < num_dram_locations) {
      // wait a bit and do some random accesses before checking reproducibility of the pattern
      if (random_rows.empty()) random_rows = mapper.get_random_nonaccessed_rows(fuzzing_params.get_max_row_no());
      do_random_accesses(random_rows, 64000); // 64ms (retention time)
    }
  }

  // store info about this bit flip (pattern ID, mapping ID, no. of bit flips)
  map_pattern_mappings_bitflips[hammering_pattern.instance_id].emplace(mapper.get_instance_id(), flipped_bits);

  // cleanup the jitter for its next use
  code_jitter.cleanup();
}